

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * __thiscall lest::env::sections_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  size_type sVar1;
  size_type sVar2;
  reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type local_58;
  size_t i;
  text msg;
  allocator<char> local_19;
  env *local_18;
  env *this_local;
  
  local_18 = this;
  this_local = (env *)__return_storage_ptr__;
  if (((this->opt).verbose & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::__cxx11::string::string((string *)&i);
    local_58 = 0;
    while( true ) {
      sVar1 = local_58;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->ctx);
      if (sVar1 == sVar2) break;
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->ctx,local_58);
      std::operator+(&local_78,"\n  ",__rhs);
      std::__cxx11::string::operator+=((string *)&i,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      local_58 = local_58 + 1;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
  }
  return __return_storage_ptr__;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }